

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_provoking_vertex
          (Impl *this,Value *state,
          VkPipelineRasterizationProvokingVertexStateCreateInfoEXT **out_info)

{
  VkProvokingVertexModeEXT VVar1;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *pVVar2;
  Type this_00;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *info;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::
           allocate_cleared<VkPipelineRasterizationProvokingVertexStateCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"provokingVertexMode");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->provokingVertexMode = VVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_provoking_vertex(const Value &state,
						 VkPipelineRasterizationProvokingVertexStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationProvokingVertexStateCreateInfoEXT>();
	*out_info = info;

	info->provokingVertexMode = static_cast<VkProvokingVertexModeEXT>(state["provokingVertexMode"].GetUint());
	return true;
}